

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_poll.c
# Opt level: O0

int mbedtls_hardclock_poll(void *data,uchar *output,size_t len,size_t *olen)

{
  unsigned_long uVar1;
  unsigned_long timer;
  size_t *olen_local;
  size_t len_local;
  uchar *output_local;
  void *data_local;
  
  uVar1 = mbedtls_timing_hardclock();
  *olen = 0;
  if (7 < len) {
    *(unsigned_long *)output = uVar1;
    *olen = 8;
  }
  return 0;
}

Assistant:

int mbedtls_hardclock_poll( void *data,
                    unsigned char *output, size_t len, size_t *olen )
{
    unsigned long timer = mbedtls_timing_hardclock();
    ((void) data);
    *olen = 0;

    if( len < sizeof(unsigned long) )
        return( 0 );

    memcpy( output, &timer, sizeof(unsigned long) );
    *olen = sizeof(unsigned long);

    return( 0 );
}